

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_char,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  byte *pbVar1;
  float fVar2;
  byte bVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  float *pfVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  
  bVar3 = (k->res).ulog2;
  iVar12 = nTxChan << (bVar3 & 0x1f);
  lVar6 = (long)iVar12 * (long)k->vw;
  if ((int)lVar6 != 0) {
    pbVar8 = (byte *)((long)data + (long)(((k->v << (bVar3 & 0x1f)) + k->u) * nTxChan));
    pbVar7 = pbVar8 + lVar6;
    pfVar4 = k->ku;
    pfVar10 = k->kv;
    lVar11 = (long)nTxChan;
    lVar6 = k->uw * lVar11;
    iVar9 = (int)lVar6;
    do {
      fVar14 = (float)*pbVar8 * *pfVar4;
      lVar13 = lVar6;
      pfVar5 = pfVar4;
      if (iVar9 != nTxChan) {
        do {
          pbVar1 = pbVar8 + lVar11;
          pbVar8 = pbVar8 + lVar11;
          fVar14 = fVar14 + (float)*pbVar1 * pfVar5[1];
          lVar13 = lVar13 - lVar11;
          pfVar5 = pfVar5 + 1;
        } while (lVar11 != lVar13);
      }
      pbVar8 = pbVar8 + (iVar12 - iVar9) + lVar11;
      fVar2 = *pfVar10;
      pfVar10 = pfVar10 + 1;
      *result = fVar14 * fVar2 + *result;
    } while (pbVar8 != pbVar7);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }